

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O2

bool ON_WildCardMatchNoCase(wchar_t *s,wchar_t *pattern)

{
  wchar_t *pwVar1;
  bool bVar2;
  wint_t wVar3;
  wint_t wVar4;
  wchar_t __wc;
  bool bVar5;
  
LAB_0066e0c0:
  if ((pattern != (wchar_t *)0x0) && (__wc = *pattern, __wc != L'\0')) {
    if (__wc != L'*') {
      do {
        if (__wc == L'?') {
          if (*s == L'\0') {
            return false;
          }
        }
        else {
          if (__wc == L'\\') {
            __wc = pattern[1];
            if ((__wc == L'?') || (__wc == L'*')) {
              pattern = pattern + 1;
            }
            else {
              __wc = L'\\';
            }
          }
          else if (__wc == L'*') goto LAB_0066e0c0;
          wVar3 = towupper(__wc);
          wVar4 = towupper(*s);
          if (wVar3 != wVar4) {
            return false;
          }
          if (*s == L'\0') goto LAB_0066e16e;
        }
        s = s + 1;
        __wc = pattern[1];
        pattern = pattern + 1;
      } while( true );
    }
    do {
      pwVar1 = pattern + 1;
      pattern = pattern + 1;
    } while (*pwVar1 == L'*');
    if (*pwVar1 != L'\0') {
      do {
        bVar5 = *s != L'\0';
        if (!bVar5) {
          return bVar5;
        }
        bVar2 = ON_WildCardMatchNoCase(s,pattern);
        s = s + 1;
      } while (!bVar2);
      return bVar5;
    }
    goto LAB_0066e16e;
  }
  if (s == (wchar_t *)0x0) {
LAB_0066e16e:
    bVar5 = true;
  }
  else {
    bVar5 = *s == L'\0';
  }
  return bVar5;
}

Assistant:

bool ON_WildCardMatchNoCase(const wchar_t* s, const wchar_t* pattern)
{
  if ( !pattern || !pattern[0] ) {
    return ( !s || !s[0] ) ? true : false;
  }

  if ( *pattern == '*' )
  {
    pattern++;
    while ( *pattern == '*' )
      pattern++;

    if ( !pattern[0] )
      return true;

    while (*s) {
      if ( ON_WildCardMatchNoCase(s,pattern) )
        return true;
      s++;
    }

    return false;
  }

  while ( *pattern != '*' )
  {
    if ( *pattern == '?' )
    {
      if ( *s) {
        pattern++;
        s++;
        continue;
      }
      return false;
    }

    if ( *pattern == '\\' )
    {
      switch( pattern[1] )
      {
      case '*':
      case '?':
        pattern++;
        break;
      }
    }
    if ( towupper(*pattern) != towupper(*s) )
    {
      return false;
    }

    if ( *s == 0 )
      return true;

    pattern++;
    s++;
  }

  return ON_WildCardMatchNoCase(s,pattern);
}